

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

bool __thiscall particleSamples::decide_to_pick_OSCAR(particleSamples *this,int POI,int monval)

{
  int iVar1;
  byte bVar2;
  
  switch(POI) {
  case 0x270c:
    iVar1 = particle_decay::get_particle_strange_number(this->decayer_ptr,monval);
    break;
  case 0x270d:
    iVar1 = particle_decay::get_particle_baryon_number(this->decayer_ptr,monval);
    break;
  case 0x270e:
    iVar1 = particle_decay::get_particle_charge(this->decayer_ptr,monval);
    break;
  case 9999:
    iVar1 = particle_decay::get_particle_charge(this->decayer_ptr,monval);
    return iVar1 != 0;
  default:
    if (POI == -0x270e) {
      iVar1 = particle_decay::get_particle_charge(this->decayer_ptr,monval);
      bVar2 = (byte)((uint)iVar1 >> 0x18);
    }
    else if (POI == -0x270d) {
      iVar1 = particle_decay::get_particle_baryon_number(this->decayer_ptr,monval);
      bVar2 = (byte)((uint)iVar1 >> 0x18);
    }
    else {
      if (POI != -0x270c) {
        if (POI == 99999) {
          return true;
        }
        return monval == POI;
      }
      iVar1 = particle_decay::get_particle_strange_number(this->decayer_ptr,monval);
      bVar2 = (byte)((uint)iVar1 >> 0x18);
    }
    return (bool)(bVar2 >> 7);
  }
  return 0 < iVar1;
}

Assistant:

bool particleSamples::decide_to_pick_OSCAR(int POI, int monval) {
    bool pick_flag = false;
    if (POI == 99999) {
        // all particles
        pick_flag = true;
    } else if (POI == 9999) {
        // charged particles
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge != 0) {
            pick_flag = true;
        }
    } else if (POI == 9998) {
        // positive charged particles
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge > 0) {
            pick_flag = true;
        }
    } else if (POI == -9998) {
        // negative charged particles
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge < 0) {
            pick_flag = true;
        }
    } else if (POI == 9997) {
        // baryons
        int baryon = decayer_ptr->get_particle_baryon_number(monval);
        if (baryon > 0) {
            pick_flag = true;
        }
    } else if (POI == -9997) {
        // anti-baryons
        int baryon = decayer_ptr->get_particle_baryon_number(monval);
        if (baryon < 0) {
            pick_flag = true;
        }
    } else if (POI == 9996) {
        // strangeness
        int strange = decayer_ptr->get_particle_strange_number(monval);
        if (strange > 0) {
            pick_flag = true;
        }
    } else if (POI == -9996) {
        // anti-strangeness
        int strange = decayer_ptr->get_particle_strange_number(monval);
        if (strange < 0) {
            pick_flag = true;
        }
    } else {
        if (monval == POI) {
            pick_flag = true;
        }
    }
    return (pick_flag);
}